

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O1

double ON_BoundingBoxTolerance(int dim,double *bboxmin,double *bboxmax)

{
  ulong uVar1;
  char *sFormat;
  int line_number;
  double dVar2;
  double dVar3;
  
  if ((bboxmax == (double *)0x0 || bboxmin == (double *)0x0) || dim < 1) {
    sFormat = "dim > 0 && bboxmin != nullptr && bboxmax != nullptr is false";
    line_number = 0xc09;
LAB_003def7f:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_bounding_box.cpp"
               ,line_number,"",sFormat);
    dVar2 = 0.0;
  }
  else {
    uVar1 = 0;
    do {
      if (bboxmax[uVar1] < bboxmin[uVar1]) {
        sFormat = "bboxmin[i] <= bboxmax[i] is false";
        line_number = 0xc0b;
        goto LAB_003def7f;
      }
      uVar1 = uVar1 + 1;
    } while ((uint)dim != uVar1);
    dVar2 = ON_ArrayDistance(dim,bboxmin,bboxmax);
    dVar2 = dVar2 * 2.220446049250313e-16;
    uVar1 = 0;
    do {
      dVar3 = (bboxmax[uVar1] - bboxmin[uVar1]) * 1.490116119385e-08;
      if (dVar3 <= dVar2) {
        dVar3 = dVar2;
      }
      dVar2 = (ABS(bboxmax[uVar1]) - ABS(bboxmin[uVar1])) * 2.220446049250313e-16;
      if (dVar2 <= dVar3) {
        dVar2 = dVar3;
      }
      uVar1 = uVar1 + 1;
    } while ((uint)dim != uVar1);
    dVar3 = 2.3283064365386963e-10;
    if (2.3283064365386963e-10 <= dVar2) {
      dVar3 = dVar2;
    }
    dVar2 = (double)(~-(ulong)(0.0 < dVar2) & (ulong)dVar2 | (ulong)dVar3 & -(ulong)(0.0 < dVar2));
  }
  return dVar2;
}

Assistant:

double ON_BoundingBoxTolerance(
        int dim,
        const double* bboxmin,
        const double* bboxmax
        )
{
  int i;
  double x, tolerance=0.0;

#if defined(ON_COMPILER_MSC)
#pragma ON_PRAGMA_WARNING_PUSH
// Disable the MSC /W4 "conditional expression is constant" warning
// generated by the do {...} while(0) in the ON_ASSERT_OR_RETURN macro.
#pragma ON_PRAGMA_WARNING_DISABLE_MSC( 4127 )
#endif

  ON_ASSERT_OR_RETURN( dim > 0 && bboxmin != nullptr && bboxmax != nullptr,tolerance);
  for ( i = 0; i < dim; i++ ) {
    ON_ASSERT_OR_RETURN(bboxmin[i] <= bboxmax[i],tolerance);
  }

#if defined(ON_COMPILER_MSC)
#pragma ON_PRAGMA_WARNING_POP
#endif

  tolerance = ON_ArrayDistance(dim,bboxmin,bboxmax)*ON_EPSILON;
  for ( i = 0; i < dim; i++ ) {
    x = (bboxmax[i] - bboxmin[i])*ON_SQRT_EPSILON;
    if ( x > tolerance )
      tolerance = x;
    x = (fabs(bboxmax[i]) - fabs(bboxmin[i]))*ON_EPSILON;
    if ( x > tolerance )
      tolerance = x;
  }
  if ( tolerance > 0.0 && tolerance < ON_ZERO_TOLERANCE )
    tolerance = ON_ZERO_TOLERANCE;
  return tolerance;
}